

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodePrintAllStats(void *cvode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar6 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar5 = 0x65d;
  }
  else {
    if (fmt < 2) {
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %.15g\n",*(undefined8 *)((long)cvode_mem + 0x168),0x1d,
                "Current time");
      }
      else {
        fprintf((FILE *)outfile,"%s,% .15e",*(undefined8 *)((long)cvode_mem + 0x168),"Current time")
        ;
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x358);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Steps",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","Steps",uVar1);
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x380);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Error test fails",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","Error test fails",uVar1);
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x368);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"NLS step fails",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","NLS step fails",uVar1);
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x438);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %.15g\n",0x1d,"Initial step size");
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,% .15e",uVar1,"Initial step size");
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x440);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %.15g\n",0x1d,"Last step size");
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,% .15e",uVar1,"Last step size");
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x150);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %.15g\n",0x1d,"Current step size");
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,% .15e",uVar1,"Current step size");
      }
      iVar5 = *(int *)((long)cvode_mem + 0x428);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Last method order",(long)iVar5);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","Last method order",(long)iVar5);
      }
      iVar5 = *(int *)((long)cvode_mem + 0x128);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Current method order",(long)iVar5);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","Current method order",(long)iVar5);
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x558);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Stab. lim. order reductions",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","Stab. lim. order reductions",uVar1);
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x360);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"RHS fn evals",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","RHS fn evals",uVar1);
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x370);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"NLS iters",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","NLS iters",uVar1);
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x378);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"NLS fails",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","NLS fails",uVar1);
      }
      lVar2 = *(long *)((long)cvode_mem + 0x358);
      if (0 < lVar2) {
        lVar3 = *(long *)((long)cvode_mem + 0x370);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %.15g\n",0x1d,"NLS iters per step");
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,% .15e",(double)lVar3 / (double)lVar2,"NLS iters per step");
        }
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x388);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"LS setups",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","LS setups",uVar1);
      }
      lVar2 = *(long *)((long)cvode_mem + 0x410);
      if (lVar2 != 0) {
        uVar1 = *(undefined8 *)(lVar2 + 0x88);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Jac fn evals",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","Jac fn evals",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 0x90);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"LS RHS fn evals",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","LS RHS fn evals",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 0xa0);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Prec setup evals",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","Prec setup evals",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 0xb0);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Prec solves",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","Prec solves",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 0xa8);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"LS iters",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","LS iters",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 0xb8);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"LS fails",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","LS fails",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 0xc0);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Jac-times setups",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","Jac-times setups",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 200);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Jac-times evals",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","Jac-times evals",uVar1);
        }
        lVar3 = *(long *)((long)cvode_mem + 0x370);
        if (0 < lVar3) {
          lVar4 = *(long *)(lVar2 + 0xa8);
          if (fmt == SUN_OUTPUTFORMAT_TABLE) {
            fprintf((FILE *)outfile,"%-*s = %.15g\n",0x1d,"LS iters per NLS iter");
          }
          else {
            fputc(0x2c,(FILE *)outfile);
            fprintf((FILE *)outfile,"%s,% .15e",(double)lVar4 / (double)lVar3,
                    "LS iters per NLS iter");
          }
          lVar3 = *(long *)(lVar2 + 0x88);
          lVar4 = *(long *)((long)cvode_mem + 0x370);
          if (fmt == SUN_OUTPUTFORMAT_TABLE) {
            fprintf((FILE *)outfile,"%-*s = %.15g\n",0x1d,"Jac evals per NLS iter");
          }
          else {
            fputc(0x2c,(FILE *)outfile);
            fprintf((FILE *)outfile,"%s,% .15e",(double)lVar3 / (double)lVar4,
                    "Jac evals per NLS iter");
          }
          lVar2 = *(long *)(lVar2 + 0xa0);
          lVar3 = *(long *)((long)cvode_mem + 0x370);
          if (fmt == SUN_OUTPUTFORMAT_TABLE) {
            fprintf((FILE *)outfile,"%-*s = %.15g\n",0x1d,"Prec evals per NLS iter");
          }
          else {
            fputc(0x2c,(FILE *)outfile);
            fprintf((FILE *)outfile,"%s,% .15e",(double)lVar2 / (double)lVar3,
                    "Prec evals per NLS iter");
          }
        }
      }
      uVar1 = *(undefined8 *)((long)cvode_mem + 0x5c8);
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Root fn evals",uVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld","Root fn evals",uVar1);
      }
      lVar2 = *(long *)((long)cvode_mem + 0x5e0);
      if (lVar2 != 0) {
        uVar1 = *(undefined8 *)(lVar2 + 0x40);
        if (fmt == SUN_OUTPUTFORMAT_TABLE) {
          fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Projection fn evals",uVar1);
        }
        else {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","Projection fn evals",uVar1);
        }
        uVar1 = *(undefined8 *)(lVar2 + 0x48);
        if (fmt != SUN_OUTPUTFORMAT_TABLE) {
          fputc(0x2c,(FILE *)outfile);
          fprintf((FILE *)outfile,"%s,%ld","Projection fails",uVar1);
          return 0;
        }
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,"Projection fails",uVar1);
        return 0;
      }
      return 0;
    }
    msgfmt = "Invalid formatting option.";
    iVar6 = -0x16;
    error_code = -0x16;
    iVar5 = 0x665;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar5,"CVodePrintAllStats",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                 ,msgfmt);
  return iVar6;
}

Assistant:

int CVodePrintAllStats(void* cvode_mem, FILE* outfile, SUNOutputFormat fmt)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeProjMem cvproj_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (fmt != SUN_OUTPUTFORMAT_TABLE && fmt != SUN_OUTPUTFORMAT_CSV)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid formatting option.");
    return (CV_ILL_INPUT);
  }

  /* step and method stats */
  sunfprintf_real(outfile, fmt, SUNTRUE, "Current time", cv_mem->cv_tn);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Steps", cv_mem->cv_nst);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Error test fails", cv_mem->cv_netf);
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS step fails", cv_mem->cv_ncfn);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Initial step size", cv_mem->cv_h0u);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Last step size", cv_mem->cv_hu);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Current step size", cv_mem->cv_next_h);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Last method order", cv_mem->cv_qu);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Current method order",
                  cv_mem->cv_next_q);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Stab. lim. order reductions",
                  cv_mem->cv_nor);
  /* function evaluations */
  sunfprintf_long(outfile, fmt, SUNFALSE, "RHS fn evals", cv_mem->cv_nfe);
  /* nonlinear solver stats */
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS iters", cv_mem->cv_nni);
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS fails", cv_mem->cv_nnf);
  if (cv_mem->cv_nst > 0)
  {
    sunfprintf_real(outfile, fmt, SUNFALSE, "NLS iters per step",
                    (sunrealtype)cv_mem->cv_nni / (sunrealtype)cv_mem->cv_nst);
  }
  sunfprintf_long(outfile, fmt, SUNFALSE, "LS setups", cv_mem->cv_nsetups);
  if (cv_mem->cv_lmem)
  {
    cvls_mem = (CVLsMem)(cv_mem->cv_lmem);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac fn evals", cvls_mem->nje);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS RHS fn evals", cvls_mem->nfeDQ);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Prec setup evals", cvls_mem->npe);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Prec solves", cvls_mem->nps);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS iters", cvls_mem->nli);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS fails", cvls_mem->ncfl);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac-times setups",
                    cvls_mem->njtsetup);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac-times evals", cvls_mem->njtimes);
    if (cv_mem->cv_nni > 0)
    {
      sunfprintf_real(outfile, fmt, SUNFALSE, "LS iters per NLS iter",
                      (sunrealtype)cvls_mem->nli / (sunrealtype)cv_mem->cv_nni);
      sunfprintf_real(outfile, fmt, SUNFALSE, "Jac evals per NLS iter",
                      (sunrealtype)cvls_mem->nje / (sunrealtype)cv_mem->cv_nni);
      sunfprintf_real(outfile, fmt, SUNFALSE, "Prec evals per NLS iter",
                      (sunrealtype)cvls_mem->npe / (sunrealtype)cv_mem->cv_nni);
    }
  }
  /* rootfinding stats */
  sunfprintf_long(outfile, fmt, SUNFALSE, "Root fn evals", cv_mem->cv_nge);
  /* projection stats */
  if (cv_mem->proj_mem)
  {
    cvproj_mem = (CVodeProjMem)(cv_mem->proj_mem);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Projection fn evals",
                    cvproj_mem->nproj);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Projection fails",
                    cvproj_mem->npfails);
  }

  return (CV_SUCCESS);
}